

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# upd7759.c
# Opt level: O0

void upd7759_update(void *param,UINT32 samples,DEV_SMPL **outputs)

{
  short sVar1;
  DEV_SMPL *pDVar2;
  DEV_SMPL *pDVar3;
  bool bVar4;
  uint local_48;
  int clocks_this_time;
  INT16 sample;
  DEV_SMPL *buffer2;
  DEV_SMPL *buffer;
  UINT32 i;
  upd7759_state *chip;
  DEV_SMPL **outputs_local;
  UINT32 samples_local;
  void *param_local;
  
  pDVar2 = *outputs;
  pDVar3 = outputs[1];
  buffer._4_4_ = 0;
  if (*(char *)((long)param + 0x38) != '\0') {
    for (; buffer._4_4_ < samples; buffer._4_4_ = buffer._4_4_ + 1) {
      if (*(char *)((long)param + 0x80) == '\0') {
        sVar1 = *(short *)((long)param + 0x5e);
      }
      else {
        sVar1 = 0;
      }
      pDVar2[buffer._4_4_] = (int)sVar1 << 7;
      pDVar3[buffer._4_4_] = (int)sVar1 << 7;
      *(int *)((long)param + 0x24) = *(int *)((long)param + 0x28) + *(int *)((long)param + 0x24);
      if (*(int *)((long)param + 0x58) == 0) {
        do {
          bVar4 = false;
          if (*(long *)((long)param + 0x68) != 0) {
            bVar4 = 0xfffff < *(uint *)((long)param + 0x24);
          }
          if (!bVar4) break;
          local_48 = *(uint *)((long)param + 0x24) >> 0x14;
          if (*(int *)((long)param + 0x3c) < (int)local_48) {
            local_48 = *(uint *)((long)param + 0x3c);
          }
          *(uint *)((long)param + 0x24) = *(int *)((long)param + 0x24) + local_48 * -0x100000;
          *(uint *)((long)param + 0x3c) = *(int *)((long)param + 0x3c) - local_48;
        } while ((*(int *)((long)param + 0x3c) != 0) ||
                (advance_state((upd7759_state *)param), *(char *)((long)param + 0x38) != '\0'));
      }
      else {
        while (*(int *)((long)param + 0x3c) <= (int)(*(uint *)((long)param + 0x24) >> 0x14)) {
          *(int *)((long)param + 0x24) =
               *(int *)((long)param + 0x24) + *(int *)((long)param + 0x3c) * -0x100000;
          *(undefined4 *)((long)param + 0x3c) = 0;
          upd7759_slave_update(param);
        }
        *(uint *)((long)param + 0x3c) =
             *(int *)((long)param + 0x3c) - (*(uint *)((long)param + 0x24) >> 0x14);
        *(uint *)((long)param + 0x24) = *(uint *)((long)param + 0x24) & 0xfffff;
      }
    }
  }
  if (buffer._4_4_ < samples) {
    memset(pDVar2 + buffer._4_4_,0,(ulong)(samples - buffer._4_4_) << 2);
    memset(pDVar3 + buffer._4_4_,0,(ulong)(samples - buffer._4_4_) << 2);
  }
  return;
}

Assistant:

static void upd7759_update(void *param, UINT32 samples, DEV_SMPL **outputs)
{
	upd7759_state *chip = (upd7759_state *)param;
	UINT32 i;
	DEV_SMPL *buffer = outputs[0];
	DEV_SMPL *buffer2 = outputs[1];

	/* loop until done */
	i = 0;
	if (chip->state != STATE_IDLE)
		for (; i < samples; i++)
		{
			/* store the current sample */
			INT16 sample = chip->Muted ? 0 : chip->sample;
			buffer[i] = sample << 7;
			buffer2[i] = sample << 7;

			/* advance by the number of clocks/output sample */
			chip->pos += chip->step;

			if (chip->mode == MODE_STAND_ALONE)
			{
				/* handle clocks, but only in standalone mode */
				while (chip->rom != NULL && chip->pos >= FRAC_ONE)
				{
					int clocks_this_time = chip->pos >> FRAC_BITS;
					if (clocks_this_time > chip->clocks_left)
						clocks_this_time = chip->clocks_left;

					/* clock once */
					chip->pos -= clocks_this_time * FRAC_ONE;
					chip->clocks_left -= clocks_this_time;

					/* if we're out of clocks, time to handle the next state */
					if (chip->clocks_left == 0)
					{
						/* advance one state; if we hit idle, bail */
						advance_state(chip);
						if (chip->state == STATE_IDLE)
							break;
					}
				}
			}
			else
			{
				while(chip->clocks_left <= (INT32)(chip->pos >> FRAC_BITS))
				{
					chip->pos -= chip->clocks_left << FRAC_BITS;
					chip->clocks_left = 0;
					upd7759_slave_update(chip);
				}
				chip->clocks_left -= (chip->pos >> FRAC_BITS);
				chip->pos &= FRAC_MASK;
			}
		}

	/* if we got out early, just zap the rest of the buffer */
	if (i < samples)
	{
		samples -= i;
		memset(&buffer[i], 0, samples * sizeof(DEV_SMPL));
		memset(&buffer2[i], 0, samples * sizeof(DEV_SMPL));
	}
}